

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.h
# Opt level: O2

void __thiscall
upb::generator::Plugin::AddOutputFile(Plugin *this,string_view filename,string_view content)

{
  google_protobuf_compiler_CodeGeneratorResponse_File *msg;
  upb_StringView uVar1;
  
  msg = google_protobuf_compiler_CodeGeneratorResponse_add_file
                  (this->response_,
                   (this->arena_).ptr_._M_t.super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>.
                   _M_t.super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
                   super__Head_base<0UL,_upb_Arena_*,_false>._M_head_impl);
  uVar1 = StringDup(this,filename);
  google_protobuf_compiler_CodeGeneratorResponse_File_set_name(msg,uVar1);
  uVar1 = StringDup(this,content);
  google_protobuf_compiler_CodeGeneratorResponse_File_set_content(msg,uVar1);
  return;
}

Assistant:

void AddOutputFile(absl::string_view filename, absl::string_view content) {
    UPB_DESC(compiler_CodeGeneratorResponse_File)* file = UPB_DESC(
        compiler_CodeGeneratorResponse_add_file)(response_, arena_.ptr());
    UPB_DESC(compiler_CodeGeneratorResponse_File_set_name)
    (file, StringDup(filename));
    UPB_DESC(compiler_CodeGeneratorResponse_File_set_content)
    (file, StringDup(content));
  }